

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

ly_bool lyxp_set_scnode_contains
                  (lyxp_set *set,lysc_node *node,lyxp_node_type node_type,int skip_idx,
                  uint32_t *index_p)

{
  ulong uVar1;
  long lVar2;
  
  lVar2 = 8;
  uVar1 = 0;
  while( true ) {
    if (set->used == uVar1) {
      return '\0';
    }
    if (((skip_idx < 0 || (uint)skip_idx != uVar1) &&
        (*(lysc_node **)((long)(set->val).nodes + lVar2 + -8) == node)) &&
       (*(lyxp_node_type *)((long)&((set->val).nodes)->node + lVar2) == node_type)) break;
    uVar1 = uVar1 + 1;
    lVar2 = lVar2 + 0x18;
  }
  if (index_p == (uint32_t *)0x0) {
    return '\x01';
  }
  *index_p = (uint32_t)uVar1;
  return '\x01';
}

Assistant:

ly_bool
lyxp_set_scnode_contains(struct lyxp_set *set, const struct lysc_node *node, enum lyxp_node_type node_type, int skip_idx,
        uint32_t *index_p)
{
    uint32_t i;

    for (i = 0; i < set->used; ++i) {
        if ((skip_idx > -1) && (i == (unsigned)skip_idx)) {
            continue;
        }

        if ((set->val.scnodes[i].scnode == node) && (set->val.scnodes[i].type == node_type)) {
            if (index_p) {
                *index_p = i;
            }
            return 1;
        }
    }

    return 0;
}